

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dxt_hc.cpp
# Opt level: O3

void __thiscall
crnlib::dxt_hc::determine_color_endpoint_codebook_task_etc(dxt_hc *this,uint64 data,void *param_2)

{
  byte bVar1;
  byte bVar2;
  bool bVar3;
  uint min_new_capacity;
  uint uVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  byte bVar7;
  int c;
  long lVar8;
  int t;
  long lVar9;
  ulong uVar10;
  int iVar11;
  uint uVar12;
  uint p;
  uchar uVar13;
  ulong uVar14;
  uchar uVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  ulong uVar19;
  int iVar20;
  uint uVar21;
  color_cluster *pcVar22;
  bool bVar23;
  float fVar24;
  color_quad_u8 endpoint;
  vector<unsigned_char> selectors;
  int scan [3];
  results results;
  int refine [4];
  etc1_optimizer optimizer;
  undefined4 local_21c;
  elemental_vector local_218;
  undefined4 local_208;
  undefined2 local_204;
  uint local_200;
  color_quad<unsigned_char,_int> *local_1f8;
  undefined1 local_1f0;
  undefined8 *local_1e8;
  undefined8 local_1e0;
  undefined1 local_1d8;
  ulong local_1d0;
  ulong local_1c8;
  dxt_hc *local_1c0;
  ulong local_1b8;
  ulong local_1b0;
  ulong local_1a8;
  ulong local_1a0;
  ulong local_198;
  long local_190;
  uchar *local_188;
  undefined8 local_180;
  undefined4 local_178;
  ulong local_170;
  byte abStack_168 [4];
  uint local_164;
  uint local_160;
  void *local_158;
  undefined4 local_148;
  undefined4 uStack_144;
  undefined4 uStack_140;
  undefined4 uStack_13c;
  etc1_optimizer local_138;
  
  local_1d0 = CONCAT44(0,this->m_pTask_pool->m_num_threads + 1);
  local_180 = 0xffffffff;
  local_178 = 1;
  local_148 = 0xfffffffd;
  uStack_144 = 0xfffffffe;
  uStack_140 = 2;
  uStack_13c = 3;
  uVar19 = (ulong)(this->m_color_clusters).m_size;
  auVar5._8_8_ = 0;
  auVar5._0_8_ = local_1d0;
  auVar6._8_8_ = 0;
  auVar6._0_8_ = uVar19 * data;
  local_1d0 = ((data + 1) * uVar19) / local_1d0;
  if (SUB164(auVar6 / auVar5,0) < (uint)local_1d0) {
    uVar19 = SUB168(auVar6 / auVar5,0) & 0xffffffff;
    local_1d0 = local_1d0 & 0xffffffff;
    local_1c0 = this;
    do {
      pcVar22 = (this->m_color_clusters).m_p;
      if (pcVar22[uVar19].pixels.m_size != 0) {
        pcVar22 = pcVar22 + uVar19;
        local_138.m_best_solution.m_selectors.m_p = (uchar *)0x0;
        local_138.m_best_solution.m_selectors.m_size = 0;
        local_138.m_best_solution.m_selectors.m_capacity = 0;
        local_138.m_sorted_luma[1].m_p = (uint *)0x0;
        local_138.m_sorted_luma[1].m_size = 0;
        local_138.m_sorted_luma[1].m_capacity = 0;
        local_138.m_sorted_luma[0].m_p = (uint *)0x0;
        local_138.m_sorted_luma[0].m_size = 0;
        local_138.m_sorted_luma[0].m_capacity = 0;
        local_138.m_luma.m_p = (unsigned_short *)0x0;
        local_138.m_luma.m_size = 0;
        local_138.m_luma.m_capacity = 0;
        local_138.m_best_solution.m_coords.m_unscaled_color.field_0.field_0.r = '\0';
        local_138.m_best_solution.m_coords._1_8_ = 0;
        local_138.m_best_selectors.m_p = (uchar *)0x0;
        local_138.m_best_selectors.m_size._0_1_ = 0;
        local_138.m_best_selectors._9_7_ = 0;
        local_138.m_selectors.m_p = (uchar *)0x0;
        local_138.m_selectors.m_size = 0;
        local_138.m_selectors.m_capacity = 0;
        local_138.m_best_solution.m_error = 0xffffffffffffffff;
        local_138.m_best_solution.m_valid = false;
        local_138.m_trial_solution.m_coords.m_color4 = false;
        local_138.m_trial_solution.m_coords.m_unscaled_color.field_0 =
             (anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3)0x0;
        local_138.m_trial_solution.m_coords.m_inten_table = 0;
        local_138.m_trial_solution.m_selectors.m_p = (uchar *)0x0;
        local_138.m_trial_solution.m_selectors.m_size = 0;
        local_138.m_trial_solution.m_selectors.m_capacity = 0;
        local_138.m_trial_solution.m_error = 0xffffffffffffffff;
        local_138.m_trial_solution.m_valid = false;
        local_138.m_temp_selectors.m_p = (uchar *)0x0;
        local_138.m_temp_selectors.m_size = 0;
        local_138.m_temp_selectors.m_capacity = 0;
        local_138.m_pParams = (params *)0x0;
        local_138.m_pResult = (results *)0x0;
        local_138.m_pSorted_luma_indices = (uint32 *)0x0;
        local_138.m_pSorted_luma = (uint32 *)0x0;
        local_208 = 2;
        local_204 = 1;
        local_200 = 0;
        local_1f8 = (color_quad<unsigned_char,_int> *)0x0;
        local_1e8 = (undefined8 *)
                    &etc1_optimizer::params::clear_optimizer_params()::s_default_scan_delta;
        local_1e0 = 1;
        local_1f0 = 0;
        local_1d8 = 0;
        min_new_capacity = (pcVar22->pixels).m_size;
        local_218.m_p = (void *)0x0;
        local_218.m_size = 0;
        local_218.m_capacity = 0;
        if (min_new_capacity != 0) {
          elemental_vector::increase_capacity
                    (&local_218,min_new_capacity,min_new_capacity == 1,1,(object_mover)0x0,false);
          memset((void *)((local_218._8_8_ & 0xffffffff) + (long)local_218.m_p),0,
                 (ulong)(min_new_capacity - local_218.m_size));
          local_218.m_size = min_new_capacity;
        }
        local_1f8 = (pcVar22->pixels).m_p;
        local_200 = (pcVar22->pixels).m_size;
        local_160 = local_200;
        local_158 = local_218.m_p;
        etc1_optimizer::init(&local_138,(EVP_PKEY_CTX *)&local_208);
        local_1e8 = &local_180;
        local_1e0._0_4_ = 3;
        etc1_optimizer::compute(&local_138);
        if (local_200 * 0x177 < local_170) {
          local_1e8 = (undefined8 *)&local_148;
          local_1e0._0_4_ = 4;
          etc1_optimizer::compute(&local_138);
        }
        lVar8 = 0;
        do {
          *(byte *)((long)&local_21c + lVar8) = abStack_168[lVar8] >> 2 | abStack_168[lVar8] * '\b';
          lVar8 = lVar8 + 1;
        } while (lVar8 != 3);
        local_21c = CONCAT13((char)local_164,(undefined3)local_21c);
        pcVar22->first_endpoint = local_21c;
        bVar7 = (&DAT_001b7ae0)[(ulong)(local_164 & 0xff) * 2];
        bVar1 = (&DAT_001b7ae1)[(ulong)(local_164 & 0xff) * 2];
        lVar8 = 0;
        do {
          bVar2 = *(byte *)((long)&local_21c + lVar8);
          uVar15 = bVar2 - bVar1;
          if (bVar2 < bVar1) {
            uVar15 = '\0';
          }
          pcVar22->color_values[0].field_0.c[lVar8] = uVar15;
          uVar15 = bVar2 - bVar7;
          if (bVar2 < bVar7) {
            uVar15 = '\0';
          }
          pcVar22->color_values[1].field_0.c[lVar8] = uVar15;
          uVar15 = bVar7 + bVar2;
          if (CARRY1(bVar7,bVar2)) {
            uVar15 = 0xff;
          }
          uVar13 = bVar2 + bVar1;
          if (CARRY1(bVar2,bVar1)) {
            uVar13 = 0xff;
          }
          pcVar22->color_values[2].field_0.c[lVar8] = uVar15;
          pcVar22->color_values[3].field_0.c[lVar8] = uVar13;
          lVar8 = lVar8 + 1;
        } while (lVar8 != 3);
        lVar8 = 4;
        lVar9 = 0;
        do {
          pcVar22->color_values[lVar9].field_0.field_0.a = 0xff;
          lVar9 = lVar9 + 1;
          lVar8 = lVar8 + -1;
        } while (lVar8 != 0);
        fVar24 = (float)(int)(((uint)pcVar22->color_values[3].field_0.field_0.b * 0x1d2f + 0x8000 +
                               (uint)pcVar22->color_values[3].field_0.field_0.g * 0x9646 +
                               (uint)pcVar22->color_values[3].field_0.field_0.r * 0x4c8b >> 0x10) -
                             ((uint)pcVar22->color_values[0].field_0.field_0.b * 0x1d2f + 0x8000 +
                              (uint)pcVar22->color_values[0].field_0.field_0.g * 0x9646 +
                              (uint)pcVar22->color_values[0].field_0.field_0.r * 0x4c8b >> 0x10)) /
                 100.0;
        if (1.0 <= fVar24) {
          fVar24 = 1.0;
        }
        local_1c8 = uVar19;
        fVar24 = powf(fVar24,2.7);
        if (pcVar22->blocks[0].m_size != 0) {
          local_190 = (ulong)(this->m_has_subblocks ^ 1) * 8 + 8;
          uVar19 = 0;
          do {
            local_198 = uVar19;
            uVar4 = pcVar22->blocks[0].m_p[local_198];
            local_1a0 = (ulong)uVar4;
            bVar3 = this->m_has_subblocks;
            local_1a8 = (ulong)bVar3;
            local_188 = (*this->m_blocks)[0].field_0.c + (local_1a0 << (6U - bVar3 & 0x3f));
            local_1b8 = (ulong)((this->m_block_weights).m_p[local_1a0] * fVar24 * 32768.0 *
                               *(float *)(&DAT_001b7b20 +
                                         (ulong)((this->m_block_encodings).m_p[local_1a0] == '\0') *
                                         4));
            local_1b0 = 0xffff;
            if ((uint)local_1b8 < 0xffff) {
              local_1b0 = local_1b8 & 0xffffffff;
            }
            lVar8 = 0;
            uVar19 = 0;
            do {
              uVar12 = 0xffffffff;
              uVar10 = 0;
              uVar14 = 0;
              do {
                iVar16 = (uint)local_188[lVar8 * 4] -
                         (uint)pcVar22->color_values[uVar10].field_0.field_0.r;
                iVar17 = (uint)local_188[lVar8 * 4 + 1] -
                         (uint)pcVar22->color_values[uVar10].field_0.field_0.g;
                iVar20 = (uint)local_188[lVar8 * 4 + 2] -
                         (uint)pcVar22->color_values[uVar10].field_0.field_0.b;
                bVar23 = (this->m_params).m_perceptual == false;
                iVar11 = iVar17 * 0x19;
                if (bVar23) {
                  iVar11 = iVar17;
                }
                iVar18 = iVar16 * 8;
                if (bVar23) {
                  iVar18 = iVar16;
                }
                uVar21 = iVar20 * iVar20 + iVar18 * iVar16 + iVar11 * iVar17;
                bVar23 = uVar21 < uVar12;
                if (bVar23) {
                  uVar12 = uVar21;
                }
                uVar14 = uVar14 & 0xff;
                if (bVar23) {
                  uVar14 = uVar10 & 0xffffffff;
                }
                uVar10 = uVar10 + 1;
              } while (uVar10 != 4);
              uVar19 = (ulong)((uint)uVar14 & 0xff | (int)uVar19 << 2);
              lVar8 = lVar8 + 1;
            } while (lVar8 != local_190);
            uVar10 = local_1b0;
            if ((uint)local_1b8 == 0) {
              uVar10 = 1;
            }
            bVar7 = bVar3 << 4 | 0x20;
            if ((uVar4 & 1) != 0) {
              bVar7 = 0x20;
            }
            local_1c0->m_block_selectors[0].m_p[local_1a0] = uVar10 | uVar19 << (bVar7 & 0x3f);
            uVar19 = local_198 + 1;
            this = local_1c0;
          } while (local_198 + 1 < (ulong)pcVar22->blocks[0].m_size);
        }
        if (local_218.m_p != (void *)0x0) {
          crnlib_free(local_218.m_p);
        }
        etc1_optimizer::~etc1_optimizer(&local_138);
        uVar19 = local_1c8;
      }
      uVar19 = uVar19 + 1;
    } while (uVar19 < local_1d0);
  }
  return;
}

Assistant:

void dxt_hc::determine_color_endpoint_codebook_task_etc(uint64 data, void*) {
  uint num_tasks = m_pTask_pool->get_num_threads() + 1;
  uint8 delta[8][2] = { {2, 8}, {5, 17}, {9, 29}, {13, 42}, {18, 60}, {24, 80}, {33, 106}, {47, 183} };
  int scan[] = {-1, 0, 1};
  int refine[] = {-3, -2, 2, 3};
  for (uint iCluster = m_color_clusters.size() * data / num_tasks, iEnd = m_color_clusters.size() * (data + 1) / num_tasks; iCluster < iEnd; iCluster++) {
    color_cluster& cluster = m_color_clusters[iCluster];
    if (cluster.pixels.size()) {
      etc1_optimizer optimizer;
      etc1_optimizer::params params;
      params.m_use_color4 = false;
      params.m_constrain_against_base_color5 = false;
      etc1_optimizer::results results;
      crnlib::vector<uint8> selectors(cluster.pixels.size());
      params.m_pSrc_pixels = cluster.pixels.get_ptr();
      results.m_pSelectors = selectors.get_ptr();
      results.m_n = params.m_num_src_pixels = cluster.pixels.size();
      optimizer.init(params, results);
      params.m_pScan_deltas = scan;
      params.m_scan_delta_size = sizeof(scan) / sizeof(*scan);
      optimizer.compute();
      if (results.m_error > 375 * params.m_num_src_pixels) {
        params.m_pScan_deltas = refine;
        params.m_scan_delta_size = sizeof(refine) / sizeof(*refine);
        optimizer.compute();
      }
      color_quad_u8 endpoint;
      for (int c = 0; c < 3; c++)
        endpoint.c[c] = results.m_block_color_unscaled.c[c] << 3 | results.m_block_color_unscaled.c[c] >> 2;
      endpoint.c[3] = results.m_block_inten_table;
      cluster.first_endpoint = endpoint.m_u32;
      for (uint8 d0 = delta[endpoint.c[3]][0], d1 = delta[endpoint.c[3]][1], c = 0; c < 3; c++) {
        uint8 q = endpoint.c[c];
        cluster.color_values[0].c[c] = q <= d1 ? 0 : q - d1;
        cluster.color_values[1].c[c] = q <= d0 ? 0 : q - d0;
        cluster.color_values[2].c[c] = q >= 255 - d0 ? 255 : q + d0;
        cluster.color_values[3].c[c] = q >= 255 - d1 ? 255 : q + d1;
      }
      for (int t = 0; t < 4; t++)
        cluster.color_values[t].c[3] = 0xFF;
      float endpoint_weight = powf(math::minimum((cluster.color_values[3].get_luma() - cluster.color_values[0].get_luma()) / 100.0f, 1.0f), 2.7f);

      crnlib::vector<uint>& blocks = cluster.blocks[cColor];
      uint blockSize = m_has_subblocks ? 8 : 16;
      for (uint i = 0; i < blocks.size(); i++) {
        uint b = blocks[i];
        color_quad_u8* pixels = m_has_subblocks ? ((color_quad_u8(*)[8])m_blocks)[b] : m_blocks[b];
        uint weight = (uint)(math::clamp<uint>(0x8000 * endpoint_weight * m_block_weights[b] * (m_block_encodings[b] ? 0.972f : 1.0f), 1, 0xFFFF));
        uint32 selector = 0;
        for (uint p = 0; p < blockSize; p++) {
          uint error_best = cUINT32_MAX;
          uint8 s_best = 0;
          for (uint8 s = 0; s < 4; s++) {
            uint error = color::color_distance(m_params.m_perceptual, pixels[p], cluster.color_values[s], false);
            if (error < error_best) {
              s_best = s;
              error_best = error;
            }
          }
          selector = selector << 2 | s_best;
        }
        m_block_selectors[cColor][b] = (uint64)selector << (!m_has_subblocks || (b & 1) ? 32 : 48) | weight;
      }
    }
  }
}